

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[8],td_thr_type_e,char>
          (JObject *this,char (*k) [8],td_thr_type_e *v,char *c)

{
  ostream *os;
  char (*local_40) [8];
  Field<char[8],_td_thr_type_e> field;
  
  local_40 = k;
  field.k = (char (*) [8])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (td_thr_type_e *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[8],_td_thr_type_e>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }